

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O0

ID_index __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
::get_pivot(Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
            *this)

{
  ID_index IVar1;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
  *this_local;
  
  IVar1 = Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
          ::get_pivot(&this->super_Chain_column_option);
  return IVar1;
}

Assistant:

inline typename Intrusive_list_column<Master_matrix>::ID_index Intrusive_list_column<Master_matrix>::get_pivot() const
{
  static_assert(Master_matrix::isNonBasic,
                "Method not available for base columns.");  // could technically be, but is the notion useful then?

  if constexpr (Master_matrix::Option_list::is_of_boundary_type) {
    if (column_.empty()) return Master_matrix::template get_null_value<ID_index>();
    return column_.back().get_row_index();
  } else {
    return Chain_opt::get_pivot();
  }
}